

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint64_t bf_load(CPUM68KState_conflict *env,uint32_t addr,int blen,uintptr_t ra)

{
  uint uVar1;
  uint64_t uVar2;
  
  switch(blen) {
  case 0:
    uVar1 = cpu_ldub_data_ra_m68k(env,addr,ra);
    break;
  case 1:
    uVar1 = cpu_lduw_data_ra_m68k(env,addr,ra);
    break;
  case 2:
  case 3:
    uVar1 = cpu_ldl_data_ra_m68k(env,addr,ra);
    break;
  case 4:
    uVar2 = cpu_ldq_data_ra_m68k(env,addr,ra);
    return uVar2;
  default:
    return 0;
  }
  return (ulong)uVar1;
}

Assistant:

static uint64_t bf_load(CPUM68KState *env, uint32_t addr, int blen,
                        uintptr_t ra)
{
    switch (blen) {
    case 0:
        return cpu_ldub_data_ra(env, addr, ra);
    case 1:
        return cpu_lduw_data_ra(env, addr, ra);
    case 2:
    case 3:
        return cpu_ldl_data_ra(env, addr, ra);
    case 4:
        return cpu_ldq_data_ra(env, addr, ra);
    default:
        // g_assert_not_reached();
        return 0;
    }
}